

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_positionals_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  bool bVar1;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_d0;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  undefined4 local_70;
  anon_class_1_0_00000001 local_59;
  function<bool_(const_CLI::Option_*)> local_58;
  undefined1 local_38 [8];
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> opts;
  App *app_local;
  Formatter *this_local;
  
  opts.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)app;
  ::std::function<bool(CLI::Option_const*)>::
  function<CLI::Formatter::make_positionals[abi:cxx11](CLI::App_const*)const::_lambda(CLI::Option_const*)_1_,void>
            ((function<bool(CLI::Option_const*)> *)&local_58,&local_59);
  App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_38,app
                   ,&local_58);
  std::function<bool_(const_CLI::Option_*)>::~function(&local_58);
  bVar1 = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::empty
                    ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_38);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"Positionals",&local_b1);
    FormatterBase::get_label(&local_90,&this->super_FormatterBase,&local_b0);
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
              (&local_d0,
               (vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_38);
    (*(this->super_FormatterBase)._vptr_FormatterBase[3])
              (__return_storage_ptr__,this,&local_90,1,&local_d0);
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector(&local_d0);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  local_70 = 1;
  std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
            ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_positionals(const App *app) const {
    std::vector<const Option *> opts =
        app->get_options([](const Option *opt) { return !opt->get_group().empty() && opt->get_positional(); });

    if(opts.empty())
        return std::string();

    return make_group(get_label("Positionals"), true, opts);
}